

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O0

void build_3bit_d(m68k_info *info,int opcode,int size)

{
  cs_m68k *pcVar1;
  anon_union_8_5_85a7a27f_for_cs_m68k_op_0 aVar2;
  undefined4 in_EDX;
  undefined4 in_ESI;
  long in_RDI;
  cs_m68k *ext;
  cs_m68k_op *op1;
  cs_m68k_op *op0;
  undefined8 in_stack_ffffffffffffffe0;
  undefined8 in_stack_ffffffffffffffe8;
  
  pcVar1 = build_init_op((m68k_info *)CONCAT44(in_ESI,in_EDX),
                         (int)((ulong)in_stack_ffffffffffffffe8 >> 0x20),
                         (int)in_stack_ffffffffffffffe8,
                         (int)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
  pcVar1->operands[0].type = M68K_OP_IMM;
  pcVar1->operands[0].address_mode = M68K_AM_IMMEDIATE;
  aVar2.reg_pair.reg_1 = 0;
  aVar2.simm = (float)g_3bit_qdata_table[*(uint *)(in_RDI + 0x24) >> 9 & 7];
  pcVar1->operands[0].field_0 = aVar2;
  pcVar1->operands[1].address_mode = M68K_AM_REG_DIRECT_DATA;
  pcVar1->operands[1].field_0.reg = (*(uint *)(in_RDI + 0x24) & 7) + M68K_REG_D0;
  return;
}

Assistant:

static void build_3bit_d(m68k_info *info, int opcode, int size)
{
	cs_m68k_op* op0;
	cs_m68k_op* op1;
	cs_m68k* ext = build_init_op(info, opcode, 2, size);

	op0 = &ext->operands[0];
	op1 = &ext->operands[1];

	op0->type = M68K_OP_IMM;
	op0->address_mode = M68K_AM_IMMEDIATE;
	op0->imm = g_3bit_qdata_table[(info->ir >> 9) & 7];

	op1->address_mode = M68K_AM_REG_DIRECT_DATA;
	op1->reg = M68K_REG_D0 + (info->ir & 7);
}